

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Path::makePath(Path *this,string *path,InArgs *in)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  allocator<char> local_c9;
  string local_c8;
  PathArgument local_a8;
  char *local_80;
  char *beginName;
  PathArgument local_68;
  ArrayIndex local_3c;
  const_iterator cStack_38;
  ArrayIndex index;
  const_iterator itInArg;
  char *end;
  char *current;
  InArgs *in_local;
  string *path_local;
  Path *this_local;
  
  end = (char *)std::__cxx11::string::c_str();
  lVar2 = std::__cxx11::string::length();
  itInArg._M_current = (PathArgument **)(end + lVar2);
  cStack_38 = std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::
              begin(in);
  while ((PathArgument **)end != itInArg._M_current) {
    if (*end == '[') {
      end = end + 1;
      if (*end == '%') {
        addPathInArg(this,path,in,&stack0xffffffffffffffc8,kindIndex);
      }
      else {
        local_3c = 0;
        while( true ) {
          bVar5 = false;
          if (((PathArgument **)end != itInArg._M_current) && (bVar5 = false, '/' < *end)) {
            bVar5 = *end < ':';
          }
          if (!bVar5) break;
          local_3c = local_3c * 10 + *end + -0x30;
          end = end + 1;
        }
        PathArgument::PathArgument(&local_68,local_3c);
        std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
                  (&this->args_,&local_68);
        PathArgument::~PathArgument(&local_68);
      }
      if (((PathArgument **)end == itInArg._M_current) ||
         (pcVar4 = end + 1, pcVar3 = end + 1, end = pcVar4, *pcVar3 != ']')) {
        iVar1 = std::__cxx11::string::c_str();
        invalidPath(this,path,(int)end - iVar1);
      }
    }
    else if (*end == '%') {
      addPathInArg(this,path,in,&stack0xffffffffffffffc8,kindKey);
      end = end + 1;
    }
    else if ((*end == '.') || (*end == ']')) {
      end = end + 1;
    }
    else {
      local_80 = end;
      while( true ) {
        bVar5 = false;
        if ((PathArgument **)end != itInArg._M_current) {
          pcVar3 = strchr("[.",(int)*end);
          bVar5 = pcVar3 == (char *)0x0;
        }
        pcVar3 = local_80;
        if (!bVar5) break;
        end = end + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>((string *)&local_c8,pcVar3,end,&local_c9);
      PathArgument::PathArgument(&local_a8,&local_c8);
      std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
                (&this->args_,&local_a8);
      PathArgument::~PathArgument(&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
    }
  }
  return;
}

Assistant:

void Path::makePath(const JSONCPP_STRING& path, const InArgs& in) {
  const char* current = path.c_str();
  const char* end = current + path.length();
  InArgs::const_iterator itInArg = in.begin();
  while (current != end) {
    if (*current == '[') {
      ++current;
      if (*current == '%')
        addPathInArg(path, in, itInArg, PathArgument::kindIndex);
      else {
        ArrayIndex index = 0;
        for (; current != end && *current >= '0' && *current <= '9'; ++current)
          index = index * 10 + ArrayIndex(*current - '0');
        args_.push_back(index);
      }
      if (current == end || *++current != ']')
        invalidPath(path, int(current - path.c_str()));
    } else if (*current == '%') {
      addPathInArg(path, in, itInArg, PathArgument::kindKey);
      ++current;
    } else if (*current == '.' || *current == ']') {
      ++current;
    } else {
      const char* beginName = current;
      while (current != end && !strchr("[.", *current))
        ++current;
      args_.push_back(JSONCPP_STRING(beginName, current));
    }
  }
}